

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O2

_Bool COSE_Recipient_SetKey_secret
                (HCOSE_RECIPIENT hRecipient,byte *rgbKey,int cbKey,byte *rgbKid,int cbKid,
                cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  uint8_t *data;
  cn_cbor *value;
  uint8_t *data_00;
  cn_cbor_errback cbor_error;
  
  _Var1 = IsValidRecipientHandle(hRecipient);
  if (_Var1) {
    if (rgbKey == (byte *)0x0) {
LAB_00181154:
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
      goto LAB_0018116c;
    }
    pcVar3 = _COSE_map_get_int((COSE *)hRecipient,1,7,perr);
    if (pcVar3 == (cn_cbor *)0x0) {
      pcVar3 = cn_cbor_int_create(-6,&cbor_error);
      if (pcVar3 == (cn_cbor *)0x0) {
        if (perr != (cose_errback *)0x0) {
          cVar2 = _MapFromCBOR(cbor_error);
          perr->err = cVar2;
        }
        goto LAB_0018116c;
      }
      _Var1 = COSE_Recipient_map_put_int(hRecipient,1,pcVar3,2,perr);
      if (_Var1) goto LAB_001811c6;
LAB_00181308:
      value = (cn_cbor *)0x0;
      data_00 = (uint8_t *)0x0;
LAB_0018130d:
      cn_cbor_free(pcVar3);
LAB_00181364:
      if (value != (cn_cbor *)0x0) {
LAB_00181369:
        cn_cbor_free(value);
      }
      data = (uint8_t *)0x0;
      goto LAB_00181172;
    }
    if ((pcVar3->type != CN_CBOR_INT) || ((pcVar3->v).bytes != (uint8_t *)0xfffffffffffffffa))
    goto LAB_00181154;
LAB_001811c6:
    if (cbKid < 1) {
      value = (cn_cbor *)0x0;
LAB_0018124c:
      data_00 = (uint8_t *)calloc((long)cbKey,1);
      if (data_00 == (uint8_t *)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_OUT_OF_MEMORY;
        }
        data_00 = (uint8_t *)0x0;
      }
      else {
        memcpy(data_00,rgbKey,(long)cbKey);
        pcVar3 = cn_cbor_map_create(&cbor_error);
        if (pcVar3 != (cn_cbor *)0x0) {
          value = cn_cbor_int_create(4,&cbor_error);
          if (value == (cn_cbor *)0x0) {
LAB_00181379:
            value = (cn_cbor *)0x0;
          }
          else {
            _Var1 = cn_cbor_mapput_int(pcVar3,1,value,&cbor_error);
            if (_Var1) {
              value = cn_cbor_data_create(data_00,cbKey,&cbor_error);
              if (value == (cn_cbor *)0x0) goto LAB_00181379;
              _Var1 = cn_cbor_mapput_int(pcVar3,-1,value,&cbor_error);
              if (_Var1) {
                _Var1 = COSE_Recipient_SetKey(hRecipient,pcVar3,perr);
                if (_Var1) {
                  return true;
                }
                goto LAB_00181308;
              }
              data_00 = (uint8_t *)0x0;
            }
          }
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(cbor_error);
            perr->err = cVar2;
          }
          goto LAB_0018130d;
        }
        if (perr != (cose_errback *)0x0) {
          cVar2 = _MapFromCBOR(cbor_error);
          perr->err = cVar2;
        }
      }
      goto LAB_00181364;
    }
    data = (uint8_t *)calloc((ulong)(uint)cbKid,1);
    if (data == (uint8_t *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
      goto LAB_0018116c;
    }
    memcpy(data,rgbKid,(ulong)(uint)cbKid);
    value = cn_cbor_data_create(data,cbKid,&cbor_error);
    if (value != (cn_cbor *)0x0) {
      _Var1 = COSE_Recipient_map_put_int(hRecipient,4,value,2,perr);
      if (_Var1) goto LAB_0018124c;
      data_00 = (uint8_t *)0x0;
      goto LAB_00181369;
    }
    if (perr != (cose_errback *)0x0) {
      cVar2 = _MapFromCBOR(cbor_error);
      perr->err = cVar2;
    }
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
LAB_0018116c:
    data = (uint8_t *)0x0;
  }
  data_00 = (uint8_t *)0x0;
LAB_00181172:
  free(data);
  free(data_00);
  return false;
}

Assistant:

bool COSE_Recipient_SetKey_secret(HCOSE_RECIPIENT hRecipient, const byte * rgbKey, int cbKey, const byte * rgbKid, int cbKid, cose_errback * perr)
{
	COSE_RecipientInfo * p;
	cn_cbor * cn_Temp = NULL;
	cn_cbor * cnTemp = NULL;
	cn_cbor_errback cbor_error;
	byte * pbTemp = NULL;
	byte * pbKey = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif

	CHECK_CONDITION(IsValidRecipientHandle(hRecipient), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(rgbKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)hRecipient;

#ifdef USE_CBOR_CONTEXT
	context = &p->m_encrypt.m_message.m_allocContext;
#endif

	cn_cbor * cnAlg = _COSE_map_get_int(&p->m_encrypt.m_message, COSE_Header_Algorithm, COSE_BOTH, perr);
	if (cnAlg != NULL) {
		CHECK_CONDITION(cnAlg->type == CN_CBOR_INT && cnAlg->v.sint == COSE_Algorithm_Direct, COSE_ERR_INVALID_PARAMETER);
	}
	else {
		cn_Temp = cn_cbor_int_create(COSE_Algorithm_Direct, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);
		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_Algorithm, cn_Temp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cn_Temp = NULL;
	}

	if (cbKid > 0) {
		pbTemp = (byte *)COSE_CALLOC(cbKid, 1, context);
		CHECK_CONDITION(pbTemp != NULL, COSE_ERR_OUT_OF_MEMORY);

		memcpy(pbTemp, rgbKid, cbKid);
		cnTemp = cn_cbor_data_create(pbTemp, cbKid, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
		pbTemp = NULL;

		if (!COSE_Recipient_map_put_int(hRecipient, COSE_Header_KID, cnTemp, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
	}

	pbKey = (byte *)COSE_CALLOC(cbKey, 1, context);
	CHECK_CONDITION(pbKey != NULL, COSE_ERR_OUT_OF_MEMORY);

	memcpy(pbKey, rgbKey, cbKey);

	cn_Temp = cn_cbor_map_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cn_Temp != NULL, cbor_error);

	cnTemp = cn_cbor_int_create(4, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, COSE_Key_Type, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	cnTemp = cn_cbor_data_create(pbKey, cbKey, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
	CHECK_CONDITION_CBOR(cnTemp != NULL, cbor_error);
	pbKey = NULL;
	CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn_Temp, -1, cnTemp, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
	cnTemp = NULL;

	if (!COSE_Recipient_SetKey(hRecipient, cn_Temp, perr)) goto errorReturn;
	cn_Temp = NULL;

	return true;

errorReturn:
	if (cn_Temp != NULL) CN_CBOR_FREE(cn_Temp, context);
	if (cnTemp != NULL) CN_CBOR_FREE(cnTemp, context);
	if (pbTemp != NULL) COSE_FREE(pbTemp, context);
	if (pbKey != NULL) COSE_FREE(pbKey, context);
	return false;
}